

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opener_file_system.hpp
# Opt level: O2

string * __thiscall
duckdb::OpenerFileSystem::GetName_abi_cxx11_(string *__return_storage_ptr__,OpenerFileSystem *this)

{
  int iVar1;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x2c])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x140))
            (&local_30,(long *)CONCAT44(extraout_var,iVar1));
  ::std::operator+(__return_storage_ptr__,"OpenerFileSystem - ",&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GetName() const override {
		return "OpenerFileSystem - " + GetFileSystem().GetName();
	}